

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int IoCommandWriteCellNet(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  FILE *__s;
  char *__ptr;
  size_t sStack_30;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    pNtk = pAbc->pNtkCur;
    if (pNtk == (Abc_Ntk_t *)0x0) {
      __s = (FILE *)pAbc->Out;
      __ptr = "Empty network.\n";
      sStack_30 = 0xf;
LAB_002d36f1:
      fwrite(__ptr,sStack_30,1,__s);
    }
    else {
      if (globalUtilOptind + 1 != argc) goto LAB_002d3630;
      if (pNtk->ntkType != ABC_NTK_LOGIC) {
        __s = (FILE *)pAbc->Out;
        __ptr = "The network should be a logic network (if it an AIG, use command \"logic\")\n";
        sStack_30 = 0x4a;
        goto LAB_002d36f1;
      }
      Io_WriteCellNet(pNtk,argv[globalUtilOptind]);
    }
    iVar1 = 0;
  }
  else {
LAB_002d3630:
    fwrite("usage: write_cellnet [-h] <file>\n",0x21,1,(FILE *)pAbc->Err);
    fwrite("\t         writes the network is the cellnet format\n",0x33,1,(FILE *)pAbc->Err);
    fwrite("\t-h     : print the help massage\n",0x21,1,(FILE *)pAbc->Err);
    fwrite("\tfile   : the name of the file to write\n",0x28,1,(FILE *)pAbc->Err);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int IoCommandWriteCellNet( Abc_Frame_t * pAbc, int argc, char **argv )
{
    Abc_Ntk_t * pNtk;
    char * pFileName;
    int c;
    extern void Io_WriteCellNet( Abc_Ntk_t * pNtk, char * pFileName );

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pNtkCur == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    pNtk = pAbc->pNtkCur;
    // get the output file name
    pFileName = argv[globalUtilOptind];
    // call the corresponding file writer
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        fprintf( pAbc->Out, "The network should be a logic network (if it an AIG, use command \"logic\")\n" );
        return 0;
    }
    Io_WriteCellNet( pNtk, pFileName );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_cellnet [-h] <file>\n" );
    fprintf( pAbc->Err, "\t         writes the network is the cellnet format\n" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write\n" );
    return 1;
}